

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

Abc_Ntk_t *
Abc_FlowRetime_MinReg
          (Abc_Ntk_t *pNtk,int fVerbose,int fComputeInitState,int fGuaranteeInitState,
          int fBlockConst,int fForwardOnly,int fBackwardOnly,int nMaxIters,int maxDelay,
          int fFastButConservative)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *pVVar5;
  Flow_Data_t *pFVar6;
  void *__ptr;
  InitConstraint_t *pData;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  int i;
  int fForwardOnly_local;
  int fBlockConst_local;
  int fGuaranteeInitState_local;
  int fComputeInitState_local;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  pManMR = (MinRegMan_t *)malloc(0xb0);
  pManMR->pNtk = pNtk;
  pManMR->fVerbose = fVerbose;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fGuaranteeInitState = fGuaranteeInitState;
  pManMR->fBlockConst = fBlockConst;
  pManMR->fForwardOnly = fForwardOnly;
  pManMR->fBackwardOnly = fBackwardOnly;
  pManMR->nMaxIters = nMaxIters;
  pManMR->maxDelay = maxDelay;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fConservTimingOnly = fFastButConservative;
  pVVar3 = Vec_PtrAlloc(100);
  pManMR->vNodes = pVVar3;
  pVVar3 = Vec_PtrAlloc(2);
  pManMR->vInitConstraints = pVVar3;
  pManMR->pInitNtk = (Abc_Ntk_t *)0x0;
  pManMR->pInitToOrig = (NodeLag_t *)0x0;
  pManMR->sizeInitToOrig = 0;
  if (pManMR->fVerbose != 0) {
    printf("Flow-based minimum-register retiming...\n");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 == 0) {
    printf("\tERROR: Can not retime with black/white boxes\n");
    pNtk_local = pNtk;
  }
  else {
    if (maxDelay != 0) {
      if (pManMR->fVerbose != 0) {
        printf("\tmax delay constraint = %d\n");
      }
      uVar2 = Abc_NtkLevel(pNtk);
      if (maxDelay < (int)uVar2) {
        printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n",
               (ulong)(uint)maxDelay,(ulong)uVar2);
        return pNtk;
      }
    }
    if (pManMR->fVerbose != 0) {
      printf("\tnetlist type = ");
    }
    iVar1 = Abc_NtkIsNetlist(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkIsLogic(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkIsStrash(pNtk);
        if (iVar1 == 0) {
          if (pManMR->fVerbose != 0) {
            printf("***unknown***/");
          }
        }
        else if (pManMR->fVerbose != 0) {
          printf("strash/");
        }
      }
      else if (pManMR->fVerbose != 0) {
        printf("logic/");
      }
    }
    else if (pManMR->fVerbose != 0) {
      printf("netlist/");
    }
    iVar1 = Abc_NtkHasSop(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasBdd(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasAig(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasMapping(pNtk);
          if (iVar1 == 0) {
            if (pManMR->fVerbose != 0) {
              printf("***unknown***\n");
            }
          }
          else if (pManMR->fVerbose != 0) {
            printf("mapped\n");
          }
        }
        else if (pManMR->fVerbose != 0) {
          printf("aig\n");
        }
      }
      else if (pManMR->fVerbose != 0) {
        printf("bdd\n");
      }
    }
    else if (pManMR->fVerbose != 0) {
      printf("sop\n");
    }
    if (pManMR->fVerbose != 0) {
      Abc_NtkLatchNum(pNtk);
      printf("\tinitial reg count = %d\n");
    }
    if (pManMR->fVerbose != 0) {
      Abc_NtkLevel(pNtk);
      printf("\tinitial levels = %d\n");
    }
    if (pManMR->fVerbose != 0) {
      Abc_FlowRetime_PrintInitStateInfo(pNtk);
    }
    if (pManMR->fVerbose != 0) {
      printf("\tpushing bubbles out of latch boxes\n");
    }
    for (pObj._0_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), (int)pObj < iVar1;
        pObj._0_4_ = (int)pObj + 1) {
      pAVar4 = Abc_NtkBox(pNtk,(int)pObj);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        Abc_FlowRetime_RemoveLatchBubbles(pAVar4);
      }
    }
    if (pManMR->fVerbose != 0) {
      Abc_FlowRetime_PrintInitStateInfo(pNtk);
    }
    for (pObj._0_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), (int)pObj < iVar1;
        pObj._0_4_ = (int)pObj + 1) {
      pAVar4 = Abc_NtkBox(pNtk,(int)pObj);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        iVar1 = Abc_ObjFaninNum(pAVar4);
        if (iVar1 != 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8c,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFanoutNum(pAVar4);
        if (iVar1 != 1) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8d,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFaninC0(pAVar4);
        if (iVar1 != 0) {
          __assert_fail("!Abc_ObjFaninC0(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8e,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        pObj_00 = Abc_ObjFanin0(pAVar4);
        iVar1 = Abc_ObjIsBi(pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsBi(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x91,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFaninNum(pObj_00);
        if (1 < iVar1) {
          __assert_fail("Abc_ObjFaninNum(pNext) <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x92,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFaninNum(pObj_00);
        if (iVar1 == 0) {
          Abc_FlowRetime_AddDummyFanin(pObj_00);
        }
        pAVar4 = Abc_ObjFanout0(pAVar4);
        iVar1 = Abc_ObjIsBo(pAVar4);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsBo(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x97,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFaninNum(pAVar4);
        if (iVar1 != 1) {
          __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x98,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar1 = Abc_ObjFaninC0(pAVar4);
        if (iVar1 != 0) {
          __assert_fail("!Abc_ObjFaninC0(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x99,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
      }
    }
    iVar1 = Abc_NtkLatchNum(pNtk);
    pManMR->nLatches = iVar1;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    pManMR->nNodes = iVar1 + 1;
    pVVar5 = Vec_IntStart(pManMR->nNodes * 2 + 10);
    pManMR->vSinkDistHist = pVVar5;
    if (maxDelay != 0) {
      Abc_FlowRetime_InitTiming(pNtk);
    }
    pVVar5 = Vec_IntStart(pManMR->nNodes);
    pManMR->vLags = pVVar5;
    memset(pManMR->vLags->pArray,0,(long)pManMR->nNodes << 2);
    pFVar6 = (Flow_Data_t *)malloc((long)pManMR->nNodes * 0x18);
    pManMR->pDataArray = pFVar6;
    Abc_FlowRetime_ClearFlows(1);
    _fComputeInitState_local = Abc_FlowRetime_MainLoop();
    for (pObj._0_4_ = 0; iVar1 = Vec_PtrSize(_fComputeInitState_local->vObjs), (int)pObj < iVar1;
        pObj._0_4_ = (int)pObj + 1) {
      pAVar4 = Abc_NtkObj(_fComputeInitState_local,(int)pObj);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && (fComputeInitState == 0)) &&
         (iVar1 = Abc_ObjIsLatch(pAVar4), iVar1 != 0)) {
        Abc_LatchSetInitDc(pAVar4);
      }
    }
    if (pManMR->pDataArray != (Flow_Data_t *)0x0) {
      free(pManMR->pDataArray);
      pManMR->pDataArray = (Flow_Data_t *)0x0;
    }
    if ((pManMR->pInitToOrig != (NodeLag_t *)0x0) && (pManMR->pInitToOrig != (NodeLag_t *)0x0)) {
      free(pManMR->pInitToOrig);
      pManMR->pInitToOrig = (NodeLag_t *)0x0;
    }
    if (pManMR->vNodes != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pManMR->vNodes);
    }
    if (pManMR->vLags != (Vec_Int_t *)0x0) {
      Vec_IntFree(pManMR->vLags);
    }
    if (pManMR->vSinkDistHist != (Vec_Int_t *)0x0) {
      Vec_IntFree(pManMR->vSinkDistHist);
    }
    if (pManMR->maxDelay != 0) {
      Abc_FlowRetime_FreeTiming(_fComputeInitState_local);
    }
    while (iVar1 = Vec_PtrSize(pManMR->vInitConstraints), iVar1 != 0) {
      __ptr = Vec_PtrPop(pManMR->vInitConstraints);
      if (*(long *)((long)__ptr + 0x10) != 0) {
        free(*(void **)((long)__ptr + 0x10));
        *(undefined8 *)((long)__ptr + 0x10) = 0;
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    }
    if (pManMR->vInitConstraints != (Vec_Ptr_t *)0x0) {
      free(pManMR->vInitConstraints);
      pManMR->vInitConstraints = (Vec_Ptr_t *)0x0;
    }
    iVar1 = Abc_NtkIsStrash(_fComputeInitState_local);
    if (iVar1 != 0) {
      Abc_NtkReassignIds(_fComputeInitState_local);
      _fComputeInitState_local = Abc_FlowRetime_NtkSilentRestrash(_fComputeInitState_local,1);
    }
    if (pManMR->fVerbose != 0) {
      uVar2 = Abc_NtkLatchNum(_fComputeInitState_local);
      printf("\tfinal reg count = %d\n",(ulong)uVar2);
    }
    if (pManMR->fVerbose != 0) {
      uVar2 = Abc_NtkLevel(_fComputeInitState_local);
      printf("\tfinal levels = %d\n",(ulong)uVar2);
    }
    Abc_NtkDoCheck(_fComputeInitState_local);
    if (pManMR != (MinRegMan_t *)0x0) {
      free(pManMR);
      pManMR = (MinRegMan_t *)0x0;
    }
    pNtk_local = _fComputeInitState_local;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t *
Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose, 
                       int fComputeInitState, int fGuaranteeInitState, int fBlockConst,
                       int fForwardOnly, int fBackwardOnly, int nMaxIters,
                       int maxDelay, int fFastButConservative ) {

  int i;
  Abc_Obj_t   *pObj, *pNext;
  InitConstraint_t *pData;

  // create manager
  pManMR = ABC_ALLOC( MinRegMan_t, 1 );

  pManMR->pNtk = pNtk;
  pManMR->fVerbose = fVerbose;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fGuaranteeInitState = fGuaranteeInitState;
  pManMR->fBlockConst = fBlockConst;
  pManMR->fForwardOnly = fForwardOnly;
  pManMR->fBackwardOnly = fBackwardOnly;
  pManMR->nMaxIters = nMaxIters;
  pManMR->maxDelay = maxDelay;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fConservTimingOnly = fFastButConservative;
  pManMR->vNodes = Vec_PtrAlloc(100);
  pManMR->vInitConstraints = Vec_PtrAlloc(2);
  pManMR->pInitNtk = NULL;
  pManMR->pInitToOrig = NULL;
  pManMR->sizeInitToOrig = 0;

  vprintf("Flow-based minimum-register retiming...\n");  

  if (!Abc_NtkHasOnlyLatchBoxes(pNtk)) {
    printf("\tERROR: Can not retime with black/white boxes\n");
    return pNtk;
  }

  if (maxDelay) {
    vprintf("\tmax delay constraint = %d\n", maxDelay);
    if (maxDelay < (i = Abc_NtkLevel(pNtk))) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n", maxDelay, i);
      return pNtk;
    }
  }

  // print info about type of network
  vprintf("\tnetlist type = ");
  if (Abc_NtkIsNetlist( pNtk )) { vprintf("netlist/"); }
  else if (Abc_NtkIsLogic( pNtk )) { vprintf("logic/"); }
  else if (Abc_NtkIsStrash( pNtk )) { vprintf("strash/"); }
  else { vprintf("***unknown***/"); }
  if (Abc_NtkHasSop( pNtk )) { vprintf("sop\n"); }
  else if (Abc_NtkHasBdd( pNtk )) { vprintf("bdd\n"); }
  else if (Abc_NtkHasAig( pNtk )) { vprintf("aig\n"); }
  else if (Abc_NtkHasMapping( pNtk )) { vprintf("mapped\n"); }
  else { vprintf("***unknown***\n"); }

  vprintf("\tinitial reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tinitial levels = %d\n", Abc_NtkLevel(pNtk));

  // remove bubbles from latch boxes
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);
  vprintf("\tpushing bubbles out of latch boxes\n");
  Abc_NtkForEachLatch( pNtk, pObj, i )
    Abc_FlowRetime_RemoveLatchBubbles(pObj);
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);

  // check for box inputs/outputs
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    assert(Abc_ObjFaninNum(pObj) == 1);
    assert(Abc_ObjFanoutNum(pObj) == 1);
    assert(!Abc_ObjFaninC0(pObj));

    pNext = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBi(pNext));
    assert(Abc_ObjFaninNum(pNext) <= 1);
    if(Abc_ObjFaninNum(pNext) == 0) // every Bi should have a fanin
      Abc_FlowRetime_AddDummyFanin( pNext );
 
    pNext = Abc_ObjFanout0(pObj);
    assert(Abc_ObjIsBo(pNext));
    assert(Abc_ObjFaninNum(pNext) == 1);
    assert(!Abc_ObjFaninC0(pNext));
  }

  pManMR->nLatches = Abc_NtkLatchNum( pNtk );
  pManMR->nNodes = Abc_NtkObjNumMax( pNtk )+1;
   
  // build histogram
  pManMR->vSinkDistHist = Vec_IntStart( pManMR->nNodes*2+10 );

  // initialize timing
  if (maxDelay)
    Abc_FlowRetime_InitTiming( pNtk );

  // create lag and Flow_Data structure
  pManMR->vLags = Vec_IntStart(pManMR->nNodes);
  memset(pManMR->vLags->pArray, 0, sizeof(int)*pManMR->nNodes);

  pManMR->pDataArray = ABC_ALLOC( Flow_Data_t, pManMR->nNodes );
  Abc_FlowRetime_ClearFlows( 1 );

  // main loop!
  pNtk = Abc_FlowRetime_MainLoop();

  // cleanup node fields
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    // if not computing init state, set all latches to DC
    if (!fComputeInitState && Abc_ObjIsLatch(pObj))
      Abc_LatchSetInitDc(pObj);
  }

  // deallocate space
  ABC_FREE( pManMR->pDataArray );
  if (pManMR->pInitToOrig) ABC_FREE( pManMR->pInitToOrig );
  if (pManMR->vNodes) Vec_PtrFree(pManMR->vNodes);
  if (pManMR->vLags) Vec_IntFree(pManMR->vLags);
  if (pManMR->vSinkDistHist) Vec_IntFree(pManMR->vSinkDistHist);
  if (pManMR->maxDelay) Abc_FlowRetime_FreeTiming( pNtk );
  while( Vec_PtrSize( pManMR->vInitConstraints )) {
    pData = (InitConstraint_t*)Vec_PtrPop( pManMR->vInitConstraints );
    //assert( pData->pBiasNode );
    //Abc_NtkDeleteObj( pData->pBiasNode );
    ABC_FREE( pData->vNodes.pArray );
    ABC_FREE( pData );
  }
  ABC_FREE( pManMR->vInitConstraints );

  // restrash if necessary
  if (Abc_NtkIsStrash(pNtk)) {
    Abc_NtkReassignIds( pNtk );
    pNtk = Abc_FlowRetime_NtkSilentRestrash( pNtk, 1 );
  }
  
  vprintf("\tfinal reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tfinal levels = %d\n", Abc_NtkLevel(pNtk));

#if defined(DEBUG_CHECK)
  Abc_NtkDoCheck( pNtk );
#endif

  // free manager
  ABC_FREE( pManMR );

  return pNtk;
}